

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void dequantize_row_q4_0(block_q4_0 *x,float *y,int64_t k)

{
  float *pfVar1;
  float fVar2;
  undefined4 uVar3;
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  ulong uVar7;
  undefined1 auVar8 [13];
  undefined1 auVar9 [16];
  uint uVar10;
  uint8_t *puVar11;
  ulong uVar12;
  float *pfVar13;
  long lVar14;
  byte bVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  
  auVar9 = _DAT_0014e6d0;
  lVar14 = k + 0x1f;
  if (-1 < k) {
    lVar14 = k;
  }
  uVar10 = (uint)(lVar14 >> 5);
  if (0 < (int)uVar10) {
    puVar11 = x->qs;
    pfVar13 = y + 0x10;
    uVar12 = 0;
    do {
      fVar2 = ggml_table_f32_f16[x[uVar12].d];
      lVar14 = 0;
      do {
        uVar3 = *(undefined4 *)(puVar11 + lVar14);
        bVar16 = (byte)((uint)uVar3 >> 0x18);
        uVar7 = (ulong)(ushort)uVar3 & 0xffffffffffff00ff;
        auVar4._8_4_ = 0;
        auVar4._0_8_ = uVar7;
        auVar4[0xc] = bVar16;
        auVar5[8] = (char)((uint)uVar3 >> 0x10);
        auVar5._0_8_ = uVar7;
        auVar5[9] = 0;
        auVar5._10_3_ = auVar4._10_3_;
        auVar8._5_8_ = 0;
        auVar8._0_5_ = auVar5._8_5_;
        auVar15._0_4_ = (uint)uVar7;
        auVar6[4] = (char)((uint)uVar3 >> 8);
        auVar6._0_4_ = auVar15._0_4_;
        auVar6[5] = 0;
        auVar6._6_7_ = SUB137(auVar8 << 0x40,6);
        auVar15._4_9_ = auVar6._4_9_;
        auVar15._13_3_ = 0;
        auVar17 = auVar15 & auVar9;
        pfVar1 = pfVar13 + lVar14 + -0x10;
        *pfVar1 = (float)(auVar17._0_4_ + -8) * fVar2;
        pfVar1[1] = (float)(auVar17._4_4_ + -8) * fVar2;
        pfVar1[2] = (float)(auVar17._8_4_ + -8) * fVar2;
        pfVar1[3] = (float)(auVar17._12_4_ + -8) * fVar2;
        pfVar1 = pfVar13 + lVar14;
        *pfVar1 = (float)(int)((auVar15._0_4_ >> 4) - 8) * fVar2;
        pfVar1[1] = (float)(int)((auVar6._4_4_ >> 4) - 8) * fVar2;
        pfVar1[2] = (float)(int)((auVar5._8_4_ >> 4) - 8) * fVar2;
        pfVar1[3] = (float)(int)((bVar16 >> 4) - 8) * fVar2;
        lVar14 = lVar14 + 4;
      } while (lVar14 != 0x10);
      uVar12 = uVar12 + 1;
      puVar11 = puVar11 + 0x12;
      pfVar13 = pfVar13 + 0x20;
    } while (uVar12 != (uVar10 & 0x7fffffff));
  }
  return;
}

Assistant:

void dequantize_row_q4_0(const block_q4_0 * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    static const int qk = QK4_0;

    assert(k % qk == 0);

    const int nb = k / qk;

    for (int i = 0; i < nb; i++) {
        const float d = GGML_FP16_TO_FP32(x[i].d);

        for (int j = 0; j < qk/2; ++j) {
            const int x0 = (x[i].qs[j] & 0x0F) - 8;
            const int x1 = (x[i].qs[j] >>   4) - 8;

            y[i*qk + j + 0   ] = x0*d;
            y[i*qk + j + qk/2] = x1*d;
        }
    }
}